

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  int *piVar1;
  undefined8 *puVar2;
  uint *puVar3;
  DataKey *pDVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  DataKey DVar12;
  undefined1 auVar13 [16];
  int iVar14;
  double *pdVar15;
  long lVar16;
  pointer pnVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  int iVar19;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar20;
  DataKey *pDVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  ulong uVar28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_2d8 [16];
  DataKey local_2c8;
  uint uStack_2c0;
  undefined3 uStack_2bb;
  uint local_2b8;
  undefined3 uStack_2b3;
  int local_2b0;
  bool local_2ac;
  ulong local_2a8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a0;
  cpp_dec_float<50U,_int,_void> local_298;
  int local_254;
  int *local_250;
  DataKey local_248;
  DataKey DStack_240;
  DataKey local_238;
  uint uStack_230;
  undefined3 uStack_22b;
  uint local_228;
  uint uStack_224;
  int local_220;
  bool local_21c;
  undefined8 local_218;
  cpp_dec_float<50U,_int,_void> local_208;
  DataKey local_1c8;
  DataKey DStack_1c0;
  DataKey local_1b8;
  uint uStack_1b0;
  undefined3 uStack_1ab;
  uint local_1a8;
  undefined3 uStack_1a3;
  int local_1a0;
  bool local_19c;
  undefined8 local_198;
  DataKey *local_188;
  undefined4 local_17c;
  cpp_dec_float<50U,_int,_void> local_178;
  pointer local_138;
  pointer local_130;
  Type local_124;
  cpp_dec_float<50U,_int,_void> *local_120;
  undefined1 local_118 [16];
  DataKey local_108;
  uint uStack_100;
  undefined3 uStack_fb;
  uint local_f8;
  undefined3 uStack_f3;
  int local_f0;
  bool local_ec;
  undefined8 local_e8;
  undefined1 local_d8 [16];
  DataKey local_c8;
  uint uStack_c0;
  undefined3 uStack_bb;
  uint local_b8;
  undefined3 uStack_b3;
  int local_b0;
  bool local_ac;
  undefined8 local_a8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  fpclass_type *local_90;
  fpclass_type *local_88;
  pointer local_80;
  cpp_dec_float<50U,_int,_void> *local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  int *local_58;
  undefined8 uStack_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems[6] = 0;
  local_298.data._M_elems[7] = 0;
  local_298.data._M_elems[8] = 0;
  local_298.data._M_elems[9] = 0;
  local_298.exp = 0;
  local_298.neg = false;
  local_198._0_4_ = cpp_dec_float_finite;
  local_198._4_4_ = 10;
  local_1c8.info = 0;
  local_1c8.idx = 0;
  DStack_1c0.info = 0;
  DStack_1c0.idx = 0;
  local_1b8.info = 0;
  local_1b8.idx = 0;
  _uStack_1b0 = 0;
  uStack_1ab = 0;
  _local_1a8 = 0;
  uStack_1a3 = 0;
  local_1a0 = 0;
  local_19c = false;
  local_a8._0_4_ = cpp_dec_float_finite;
  local_a8._4_4_ = 10;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = 0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_c8.info = 0;
  local_c8.idx = 0;
  _uStack_c0 = 0;
  uStack_bb = 0;
  _local_b8 = 0;
  uStack_b3 = 0;
  local_b0 = 0;
  local_ac = false;
  local_e8._0_4_ = cpp_dec_float_finite;
  local_e8._4_4_ = 10;
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  local_118._8_4_ = 0;
  local_118._12_4_ = 0;
  local_108.info = 0;
  local_108.idx = 0;
  _uStack_100 = 0;
  uStack_fb = 0;
  _local_f8 = 0;
  uStack_f3 = 0;
  local_f0 = 0;
  local_ec = false;
  local_124 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_124 == LEAVE) {
    local_17c = 0;
  }
  else {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_17c = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_208.data._M_elems[8] = (uint)uVar5;
  local_208.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar9 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar11 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_208.data._M_elems[4] = (uint)uVar10;
  local_208.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
  local_208.data._M_elems[6] = (uint)uVar11;
  local_208.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
  local_208.data._M_elems[0] = (uint)uVar5;
  local_208.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
  local_208.data._M_elems[2] = (uint)uVar9;
  local_208.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
  local_208.exp = (maxabs->m_backend).exp;
  local_208.neg = (maxabs->m_backend).neg;
  local_208.fpclass = (maxabs->m_backend).fpclass;
  local_208.prec_elem = (maxabs->m_backend).prec_elem;
  local_90 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_138 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar26 = (update->thedelta).super_IdxSet.idx;
  local_130 = (update->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_178.data._M_elems._32_5_ = SUB85(uVar5,0);
  local_178.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_178.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_178.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_178.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
  local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_178.exp = (val->m_backend).exp;
  local_178.neg = (val->m_backend).neg;
  local_178.fpclass = (val->m_backend).fpclass;
  local_178.prec_elem = (val->m_backend).prec_elem;
  local_2a0 = this;
  local_40 = val;
  local_38 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    iVar14 = (update->thedelta).super_IdxSet.num;
    local_254 = -1;
    if (start < iVar14) {
      local_250 = piVar26 + iVar14;
      piVar26 = piVar26 + start;
      pUVar20 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&this->epsilon;
      pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_78 = (cpp_dec_float<50U,_int,_void> *)*pdVar15;
      uStack_70 = 0;
      local_68 = -(double)local_78;
      uStack_60 = 0x8000000000000000;
      local_120 = &(local_2a0->fastDelta).m_backend;
      local_80 = (pointer)((long)incr << 2);
      local_254 = -1;
      pSVar24 = local_2a0;
      local_98 = pUVar20;
      do {
        iVar14 = *piVar26;
        uVar5 = *(undefined8 *)((long)&local_130[iVar14].m_backend.data + 0x20);
        local_298.data._M_elems[8] = (uint)uVar5;
        local_298.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)&local_130[iVar14].m_backend.data;
        uVar9 = *(undefined8 *)((long)&local_130[iVar14].m_backend.data + 8);
        puVar3 = (uint *)((long)&local_130[iVar14].m_backend.data + 0x10);
        uVar10 = *(undefined8 *)puVar3;
        uVar11 = *(undefined8 *)(puVar3 + 2);
        local_298.data._M_elems[4] = (uint)uVar10;
        local_298.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
        local_298.data._M_elems[6] = (uint)uVar11;
        local_298.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
        local_298.data._M_elems[0] = (uint)uVar5;
        local_298.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_298.data._M_elems[2] = (uint)uVar9;
        local_298.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
        local_298.exp = local_130[iVar14].m_backend.exp;
        local_298.neg = local_130[iVar14].m_backend.neg;
        local_298.fpclass = local_130[iVar14].m_backend.fpclass;
        local_298.prec_elem = local_130[iVar14].m_backend.prec_elem;
        if (local_124 == LEAVE) {
          if (pSVar24->iscoid == true) {
            pSVar6 = (pSVar24->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar19 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[iVar14];
          }
          else {
            pSVar6 = (pSVar24->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar19 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[iVar14];
          }
          if (iVar19 < 1) goto LAB_002dab89;
          goto LAB_002daef9;
        }
LAB_002dab89:
        if ((char)local_17c != '\0') {
          pSVar6 = (pSVar24->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar6->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar7[iVar14].super_DataKey.info) {
            local_58 = piVar26;
            SPxColId::SPxColId((SPxColId *)local_2d8,pSVar7 + iVar14);
            piVar26 = local_58;
            pUVar20 = local_98;
            iVar19 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar6->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_2d8);
            pSVar24 = local_2a0;
            if ((pSVar6->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar19] == P_FIXED) goto LAB_002daef9;
          }
        }
        uVar5 = *(undefined8 *)
                 ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)pUVar20)->m_backend).data._M_elems + 8);
        _local_2b8 = (undefined5)uVar5;
        uStack_2b3 = (undefined3)((ulong)uVar5 >> 0x28);
        local_2d8 = *(undefined1 (*) [16])
                     (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pUVar20)->m_backend).data._M_elems;
        local_2c8 = *(DataKey *)
                     ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pUVar20)->m_backend).data._M_elems + 4);
        uVar5 = *(undefined8 *)
                 ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)pUVar20)->m_backend).data._M_elems + 6);
        _uStack_2c0 = (undefined5)uVar5;
        uStack_2bb = (undefined3)((ulong)uVar5 >> 0x28);
        local_2b0 = (pSVar24->epsilon).m_backend.exp;
        local_2ac = (pSVar24->epsilon).m_backend.neg;
        local_2a8._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
        local_2a8._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
        local_188 = (DataKey *)CONCAT44(local_188._4_4_,iVar14);
        if (((fpclass_type)local_2a8 == cpp_dec_float_NaN || local_298.fpclass == cpp_dec_float_NaN)
           || (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8),
              pSVar24 = local_2a0, iVar19 < 1)) {
          uVar5 = *(undefined8 *)
                   ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)pUVar20)->m_backend).data._M_elems + 8);
          _local_2b8 = (undefined5)uVar5;
          uStack_2b3 = (undefined3)((ulong)uVar5 >> 0x28);
          auVar13 = *(undefined1 (*) [16])
                     (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pUVar20)->m_backend).data._M_elems;
          local_2c8 = *(DataKey *)
                       ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)pUVar20)->m_backend).data._M_elems + 4);
          uVar5 = *(undefined8 *)
                   ((((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)pUVar20)->m_backend).data._M_elems + 6);
          _uStack_2c0 = (undefined5)uVar5;
          uStack_2bb = (undefined3)((ulong)uVar5 >> 0x28);
          local_2b0 = (pSVar24->epsilon).m_backend.exp;
          local_2ac = (pSVar24->epsilon).m_backend.neg;
          local_2a8._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
          local_2a8._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
          local_2d8._0_4_ =
               (undefined4)
               *(undefined8 *)
                (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)pUVar20)->m_backend).data._M_elems;
          if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
            local_2ac = (bool)(local_2ac ^ 1);
          }
          local_2d8 = auVar13;
          if ((((fpclass_type)local_2a8 != cpp_dec_float_NaN) &&
              (local_298.fpclass != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8),
             pSVar24 = local_2a0, iVar19 < 0)) {
            local_2d8._4_4_ = local_298.data._M_elems[1];
            local_2d8._0_4_ = local_298.data._M_elems[0];
            local_2d8._12_4_ = local_298.data._M_elems[3];
            local_2d8._8_4_ = local_298.data._M_elems[2];
            local_2c8.idx = local_298.data._M_elems[5];
            local_2c8.info = local_298.data._M_elems[4];
            _local_2b8 = (undefined5)CONCAT44(local_298.data._M_elems[9],local_298.data._M_elems[8])
            ;
            uStack_2b3 = (undefined3)(local_298.data._M_elems[9] >> 8);
            _uStack_2c0 = (undefined5)
                          CONCAT44(local_298.data._M_elems[7],local_298.data._M_elems[6]);
            uStack_2bb = (undefined3)(local_298.data._M_elems[7] >> 8);
            local_2b0 = local_298.exp;
            local_2ac = local_298.neg;
            local_2a8._0_4_ = local_298.fpclass;
            local_2a8._4_4_ = local_298.prec_elem;
            if (local_298.data._M_elems[0] != 0 || local_298.fpclass != 0) {
              local_2ac = (bool)(local_298.neg ^ 1);
            }
            if (((local_298.fpclass == 2) || (local_208.fpclass == cpp_dec_float_NaN)) ||
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_208),
               iVar19 < 1)) {
              local_248.idx = local_208.data._M_elems[2];
              local_248.info = local_208.data._M_elems[1];
              DStack_240.idx = local_208.data._M_elems[4];
              DStack_240.info = local_208.data._M_elems[3];
              local_238.idx = local_208.data._M_elems[6];
              local_238.info = local_208.data._M_elems[5];
              _uStack_230 = (undefined5)
                            CONCAT44(local_208.data._M_elems[8],local_208.data._M_elems[7]);
              uStack_22b = (undefined3)(local_208.data._M_elems[8] >> 8);
              local_228 = local_208.data._M_elems[9];
            }
            else {
              local_248.idx = local_298.data._M_elems[2];
              local_248.info = local_298.data._M_elems[1];
              DStack_240.idx = local_298.data._M_elems[4];
              DStack_240.info = local_298.data._M_elems[3];
              local_238.idx = local_298.data._M_elems[6];
              local_238.info = local_298.data._M_elems[5];
              _uStack_230 = (undefined5)
                            CONCAT44(local_298.data._M_elems[8],local_298.data._M_elems[7]);
              uStack_22b = (undefined3)(local_298.data._M_elems[8] >> 8);
              local_228 = local_298.data._M_elems[9];
              local_208.neg =
                   (bool)((local_298.fpclass != 0 || local_298.data._M_elems[0] != 0) ^
                         local_298.neg);
              local_208.data._M_elems[0] = local_298.data._M_elems[0];
              local_208.exp = local_298.exp;
              local_208._48_8_ = local_298._48_8_;
            }
            local_208.data._M_elems[9] = local_228;
            local_208.data._M_elems[5] = local_238.info;
            local_208.data._M_elems[6] = local_238.idx;
            local_208.data._M_elems[7] = (uint)_uStack_230;
            local_208.data._M_elems[8] = (uint)(CONCAT35(uStack_22b,_uStack_230) >> 0x20);
            local_208.data._M_elems[1] = local_248.info;
            local_208.data._M_elems[2] = local_248.idx;
            local_208.data._M_elems[3] = DStack_240.info;
            local_208.data._M_elems[4] = DStack_240.idx;
            local_d8._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data
            ;
            local_d8._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data + 8);
            pDVar21 = (DataKey *)
                      ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data +
                      0x10);
            local_c8 = *pDVar21;
            DVar12 = pDVar21[1];
            _uStack_c0 = DVar12._0_5_;
            uStack_bb = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).data +
                     0x20);
            _local_b8 = (undefined5)uVar5;
            uStack_b3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_b0 = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).exp;
            local_ac = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).neg;
            local_a8._0_4_ = (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).fpclass;
            local_a8._4_4_ =
                 (((pointer)((long)local_90 + (long)iVar14 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_2a8._0_4_ = cpp_dec_float_finite;
            local_2a8._4_4_ = 10;
            local_2d8 = ZEXT816(0);
            local_2c8.info = 0;
            local_2c8.idx = 0;
            _uStack_2c0 = 0;
            uStack_2bb = 0;
            _local_2b8 = 0;
            uStack_2b3 = 0;
            local_2b0 = 0;
            local_2ac = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2d8,(double)local_78);
            pSVar24 = local_2a0;
            if ((((fpclass_type)local_a8 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_2a8 != cpp_dec_float_NaN)) &&
               (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_d8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2d8), pSVar24 = local_2a0
               , iVar19 < 0)) {
              local_2a8._0_4_ = cpp_dec_float_finite;
              local_2a8._4_4_ = 10;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8.info = 0;
              local_2c8.idx = 0;
              _uStack_2c0 = 0;
              uStack_2bb = 0;
              _local_2b8 = 0;
              uStack_2b3 = 0;
              local_2b0 = 0;
              local_2ac = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_2d8 == &local_138[iVar14].m_backend) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                           (cpp_dec_float<50U,_int,_void> *)local_d8);
                if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
                  local_2ac = (bool)(local_2ac ^ 1);
                }
              }
              else {
                _local_2b8 = _local_b8;
                uStack_2b3 = uStack_b3;
                local_2c8 = local_c8;
                _uStack_2c0 = _uStack_c0;
                uStack_2bb = uStack_bb;
                local_2d8._8_8_ = local_d8._8_8_;
                local_2d8._0_8_ = local_d8._0_8_;
                local_2b0 = local_b0;
                local_2ac = local_ac;
                local_2a8._0_4_ = (fpclass_type)local_a8;
                local_2a8._4_4_ = local_a8._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_138[iVar14].m_backend);
              }
              auVar13 = local_2d8;
              _local_1a8 = _local_2b8;
              uStack_1a3 = uStack_2b3;
              local_1b8 = local_2c8;
              _uStack_1b0 = _uStack_2c0;
              uStack_1ab = uStack_2bb;
              local_1c8.info = local_2d8._0_4_;
              local_1c8.idx = local_2d8._4_4_;
              DStack_1c0.info = local_2d8._8_4_;
              DStack_1c0.idx = local_2d8._12_4_;
              local_1a0 = local_2b0;
              local_19c = local_2ac;
              local_198._0_4_ = (fpclass_type)local_2a8;
              local_198._4_4_ = local_2a8._4_4_;
              local_2d8 = auVar13;
              if ((fpclass_type)local_2a8 == cpp_dec_float_NaN) {
LAB_002db53c:
                local_218._0_4_ = cpp_dec_float_finite;
                local_218._4_4_ = 10;
                local_248.info = 0;
                local_248.idx = 0;
                DStack_240.info = 0;
                DStack_240.idx = 0;
                local_238.info = 0;
                local_238.idx = 0;
                _uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                local_220 = 0;
                local_21c = false;
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)&local_1c8;
                if ((cpp_dec_float<50U,_int,_void> *)&local_248 != local_120) {
                  local_228 = (uint)_local_1a8;
                  uStack_224 = (uint)(CONCAT35(uStack_1a3,_local_1a8) >> 0x20);
                  local_238 = local_1b8;
                  _uStack_230 = _uStack_1b0;
                  uStack_22b = uStack_1ab;
                  local_248 = local_1c8;
                  DStack_240 = DStack_1c0;
                  local_220 = local_1a0;
                  local_21c = local_19c;
                  local_218._0_4_ = (fpclass_type)local_198;
                  local_218._4_4_ = local_198._4_4_;
                  pcVar18 = local_120;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)&local_248,pcVar18);
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)&local_248;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0);
                iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2d8);
                pcVar18 = local_120;
                if (0 < iVar14) goto LAB_002db53c;
              }
              local_2ac = false;
              local_2b0 = 0;
              uStack_2b3 = 0;
              _local_2b8 = 0;
              uStack_2bb = 0;
              _uStack_2c0 = 0;
              local_2d8 = ZEXT816(0);
              local_2a8._0_4_ = cpp_dec_float_finite;
              local_2a8._4_4_ = 10;
              local_2c8.info = 0;
              local_2c8.idx = 0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar18,&local_298);
              local_298.data._M_elems[8] = (uint)_local_2b8;
              local_298.data._M_elems[9] = (uint)(CONCAT35(uStack_2b3,_local_2b8) >> 0x20);
              local_298.data._M_elems[4] = local_2c8.info;
              local_298.data._M_elems[5] = local_2c8.idx;
              local_298.data._M_elems[6] = (uint)_uStack_2c0;
              local_298.data._M_elems[7] = (uint)(CONCAT35(uStack_2bb,_uStack_2c0) >> 0x20);
              local_298.data._M_elems[0] = local_2d8._0_4_;
              local_298.data._M_elems[1] = local_2d8._4_4_;
              local_298.data._M_elems[2] = local_2d8._8_4_;
              local_298.data._M_elems[3] = local_2d8._12_4_;
              local_298.exp = local_2b0;
              local_298.neg = local_2ac;
              local_298.fpclass = (fpclass_type)local_2a8;
              local_298.prec_elem = local_2a8._4_4_;
              uVar5 = local_298._48_8_;
              local_298.fpclass = (fpclass_type)local_2a8;
              pSVar24 = local_2a0;
              if ((local_298.fpclass != cpp_dec_float_NaN) &&
                 (local_178.fpclass != cpp_dec_float_NaN)) {
                local_298._48_8_ = uVar5;
                iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_298,&local_178);
                goto joined_r0x002db68f;
              }
            }
          }
        }
        else {
          bVar8 = false;
          if ((local_298.fpclass != cpp_dec_float_NaN) && (local_208.fpclass != cpp_dec_float_NaN))
          {
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_298,&local_208);
            bVar8 = 0 < iVar19;
          }
          pcVar18 = &local_208;
          if (bVar8) {
            pcVar18 = &local_298;
          }
          pcVar23 = &local_208;
          if (bVar8) {
            pcVar23 = &local_298;
          }
          pcVar22 = &local_208;
          if (bVar8) {
            pcVar22 = &local_298;
          }
          uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          local_208.data._M_elems[8] = (uint)uVar5;
          local_208.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)(pcVar18->data)._M_elems;
          uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 2);
          uVar10 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
          uVar11 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          local_208.data._M_elems[4] = (uint)uVar10;
          local_208.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
          local_208.data._M_elems[6] = (uint)uVar11;
          local_208.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
          local_208.data._M_elems[0] = (uint)uVar5;
          local_208.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_208.data._M_elems[2] = (uint)uVar9;
          local_208.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
          local_208.exp = pcVar23->exp;
          local_208.neg = pcVar22->neg;
          uVar28 = CONCAT44((int)((uint)bVar8 << 0x1f) >> 0x1f,(int)((uint)bVar8 << 0x1f) >> 0x1f);
          local_208._48_8_ = ~uVar28 & local_208._48_8_ | local_298._48_8_ & uVar28;
          local_118._0_8_ =
               *(undefined8 *)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data;
          local_118._8_8_ =
               *(undefined8 *)
                ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data + 8);
          pDVar21 = (DataKey *)
                    ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data +
                    0x10);
          local_108 = *pDVar21;
          DVar12 = pDVar21[1];
          _uStack_100 = DVar12._0_5_;
          uStack_fb = DVar12.idx._1_3_;
          uVar5 = *(undefined8 *)
                   ((long)&(((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).data +
                   0x20);
          _local_f8 = (undefined5)uVar5;
          uStack_f3 = (undefined3)((ulong)uVar5 >> 0x28);
          local_f0 = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).exp;
          local_ec = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).neg;
          local_e8._0_4_ = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).fpclass;
          local_e8._4_4_ = (((pointer)((long)local_88 + (long)iVar14 * 0x38))->m_backend).prec_elem;
          ::soplex::infinity::__tls_init();
          local_2a8._0_4_ = cpp_dec_float_finite;
          local_2a8._4_4_ = 10;
          local_2d8 = ZEXT816(0);
          local_2c8.info = 0;
          local_2c8.idx = 0;
          _uStack_2c0 = 0;
          uStack_2bb = 0;
          _local_2b8 = 0;
          uStack_2b3 = 0;
          local_2b0 = 0;
          local_2ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_2d8,local_68);
          pSVar24 = local_2a0;
          if ((((fpclass_type)local_e8 == cpp_dec_float_NaN) ||
              ((fpclass_type)local_2a8 == cpp_dec_float_NaN)) ||
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_118,
                                  (cpp_dec_float<50U,_int,_void> *)local_2d8), pSVar24 = local_2a0,
             iVar19 < 1)) goto LAB_002daef9;
          local_2a8._0_4_ = cpp_dec_float_finite;
          local_2a8._4_4_ = 10;
          local_2d8 = (undefined1  [16])0x0;
          local_2c8.info = 0;
          local_2c8.idx = 0;
          _uStack_2c0 = 0;
          uStack_2bb = 0;
          _local_2b8 = 0;
          uStack_2b3 = 0;
          local_2b0 = 0;
          local_2ac = false;
          if ((cpp_dec_float<50U,_int,_void> *)local_2d8 == &local_138[iVar14].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                       (cpp_dec_float<50U,_int,_void> *)local_118);
            if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
              local_2ac = (bool)(local_2ac ^ 1);
            }
          }
          else {
            _local_2b8 = _local_f8;
            uStack_2b3 = uStack_f3;
            local_2c8 = local_108;
            _uStack_2c0 = _uStack_100;
            uStack_2bb = uStack_fb;
            local_2d8._8_8_ = local_118._8_8_;
            local_2d8._0_8_ = local_118._0_8_;
            local_2b0 = local_f0;
            local_2ac = local_ec;
            local_2a8._0_4_ = (fpclass_type)local_e8;
            local_2a8._4_4_ = local_e8._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_138[iVar14].m_backend);
          }
          auVar13 = local_2d8;
          _local_1a8 = _local_2b8;
          uStack_1a3 = uStack_2b3;
          local_1b8 = local_2c8;
          _uStack_1b0 = _uStack_2c0;
          uStack_1ab = uStack_2bb;
          local_1c8.info = local_2d8._0_4_;
          local_1c8.idx = local_2d8._4_4_;
          DStack_1c0.info = local_2d8._8_4_;
          DStack_1c0.idx = local_2d8._12_4_;
          local_1a0 = local_2b0;
          local_19c = local_2ac;
          local_198._0_4_ = (fpclass_type)local_2a8;
          local_198._4_4_ = local_2a8._4_4_;
          local_2d8 = auVar13;
          if ((fpclass_type)local_2a8 == cpp_dec_float_NaN) {
LAB_002db2d8:
            local_218._0_4_ = cpp_dec_float_finite;
            local_218._4_4_ = 10;
            local_248.info = 0;
            local_248.idx = 0;
            DStack_240.info = 0;
            DStack_240.idx = 0;
            local_238.info = 0;
            local_238.idx = 0;
            _uStack_230 = 0;
            uStack_22b = 0;
            local_228 = 0;
            uStack_224 = 0;
            local_220 = 0;
            local_21c = false;
            if ((cpp_dec_float<50U,_int,_void> *)&local_248 == local_120) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)&local_248,
                         (cpp_dec_float<50U,_int,_void> *)&local_1c8);
              if (local_248.info != 0 || (fpclass_type)local_218 != cpp_dec_float_finite) {
                local_21c = (bool)(local_21c ^ 1);
              }
            }
            else {
              local_228 = (uint)_local_1a8;
              uStack_224 = (uint)(CONCAT35(uStack_1a3,_local_1a8) >> 0x20);
              local_238 = local_1b8;
              _uStack_230 = _uStack_1b0;
              uStack_22b = uStack_1ab;
              local_248 = local_1c8;
              DStack_240 = DStack_1c0;
              local_220 = local_1a0;
              local_21c = local_19c;
              local_218._0_4_ = (fpclass_type)local_198;
              local_218._4_4_ = local_198._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)&local_248,local_120);
            }
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0);
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                                (cpp_dec_float<50U,_int,_void> *)local_2d8);
            if (iVar14 < 0) goto LAB_002db2d8;
            uVar5 = *(undefined8 *)((local_120->data)._M_elems + 8);
            local_228 = (uint)uVar5;
            uStack_224 = (uint)((ulong)uVar5 >> 0x20);
            local_248.info = (local_120->data)._M_elems[0];
            local_248.idx = (local_120->data)._M_elems[1];
            DStack_240 = *(DataKey *)((local_120->data)._M_elems + 2);
            local_238 = *(DataKey *)((local_120->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((local_120->data)._M_elems + 6);
            _uStack_230 = (undefined5)uVar5;
            uStack_22b = (undefined3)((ulong)uVar5 >> 0x28);
            local_220 = (local_2a0->fastDelta).m_backend.exp;
            local_21c = (local_2a0->fastDelta).m_backend.neg;
            local_218._0_4_ = (local_2a0->fastDelta).m_backend.fpclass;
            local_218._4_4_ = (local_2a0->fastDelta).m_backend.prec_elem;
            if ((fpclass_type)local_218 != cpp_dec_float_finite || local_248.info != 0) {
              local_21c = (bool)(local_21c ^ 1);
            }
          }
          local_2d8 = ZEXT816(0);
          local_2a8._0_4_ = cpp_dec_float_finite;
          local_2a8._4_4_ = 10;
          local_2ac = false;
          local_2b0 = 0;
          uStack_2b3 = 0;
          _local_2b8 = 0;
          uStack_2bb = 0;
          _uStack_2c0 = 0;
          local_2c8.info = 0;
          local_2c8.idx = 0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                     (cpp_dec_float<50U,_int,_void> *)&local_248,&local_298);
          local_298.data._M_elems[8] = (uint)_local_2b8;
          local_298.data._M_elems[9] = (uint)(CONCAT35(uStack_2b3,_local_2b8) >> 0x20);
          local_298.data._M_elems[4] = local_2c8.info;
          local_298.data._M_elems[5] = local_2c8.idx;
          local_298.data._M_elems[6] = (uint)_uStack_2c0;
          local_298.data._M_elems[7] = (uint)(CONCAT35(uStack_2bb,_uStack_2c0) >> 0x20);
          local_298.data._M_elems[0] = local_2d8._0_4_;
          local_298.data._M_elems[1] = local_2d8._4_4_;
          local_298.data._M_elems[2] = local_2d8._8_4_;
          local_298.data._M_elems[3] = local_2d8._12_4_;
          local_298.exp = local_2b0;
          local_298.neg = local_2ac;
          local_298.fpclass = (fpclass_type)local_2a8;
          local_298.prec_elem = local_2a8._4_4_;
          uVar5 = local_298._48_8_;
          local_298.fpclass = (fpclass_type)local_2a8;
          pSVar24 = local_2a0;
          if ((local_298.fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN))
          {
            local_298._48_8_ = uVar5;
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_298,&local_178);
joined_r0x002db68f:
            pSVar24 = local_2a0;
            if (0 < iVar14) {
              local_178.data._M_elems._32_5_ =
                   SUB85(CONCAT44(local_298.data._M_elems[9],local_298.data._M_elems[8]),0);
              local_178.data._M_elems[9]._1_3_ = (undefined3)(local_298.data._M_elems[9] >> 8);
              local_178.data._M_elems[1] = local_298.data._M_elems[1];
              local_178.data._M_elems[0] = local_298.data._M_elems[0];
              local_178.data._M_elems[3] = local_298.data._M_elems[3];
              local_178.data._M_elems[2] = local_298.data._M_elems[2];
              local_178.data._M_elems[5] = local_298.data._M_elems[5];
              local_178.data._M_elems[4] = local_298.data._M_elems[4];
              local_178.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_298.data._M_elems[7],local_298.data._M_elems[6]),0);
              local_178.data._M_elems[7]._1_3_ = (undefined3)(local_298.data._M_elems[7] >> 8);
              local_254 = (int)local_188;
              local_178.exp = local_298.exp;
              local_178.neg = local_298.neg;
              local_178._48_8_ = local_298._48_8_;
            }
          }
        }
LAB_002daef9:
        piVar26 = (int *)((long)piVar26 + (long)local_80);
      } while (piVar26 < local_250);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar16 = (long)((int)((ulong)((long)(update->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_138
                                 ) >> 3) * -0x49249249);
    local_98 = update;
    if (lVar16 < 1) {
      local_254 = -1;
    }
    else {
      local_80 = local_130 + lVar16;
      pDVar21 = (DataKey *)&this->epsilon;
      pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_68 = *pdVar15;
      uStack_60 = 0;
      local_58 = (int *)-local_68;
      uStack_50 = 0x8000000000000000;
      local_78 = &(local_2a0->fastDelta).m_backend;
      local_88 = &((cpp_dec_float<50U,_int,_void> *)local_88)->fpclass;
      local_90 = &((cpp_dec_float<50U,_int,_void> *)local_90)->fpclass;
      local_254 = -1;
      lVar27 = 0;
      lVar16 = 0;
      lVar25 = 0;
      pSVar24 = local_2a0;
      local_188 = pDVar21;
      do {
        uVar5 = *(undefined8 *)((long)&(local_130->m_backend).data + lVar16 + 0x20);
        local_298.data._M_elems[8] = (uint)uVar5;
        local_298.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        puVar2 = (undefined8 *)((long)&(local_130->m_backend).data + lVar16);
        uVar5 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(local_130->m_backend).data + lVar16 + 0x10);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        local_298.data._M_elems[4] = (uint)uVar10;
        local_298.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
        local_298.data._M_elems[6] = (uint)uVar11;
        local_298.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
        local_298.data._M_elems[0] = (uint)uVar5;
        local_298.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_298.data._M_elems[2] = (uint)uVar9;
        local_298.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
        local_298.exp = *(int *)((long)&(local_130->m_backend).data + lVar16 + 0x28);
        local_298.neg = *(bool *)((long)&(local_130->m_backend).data + lVar16 + 0x2c);
        local_298._48_8_ = *(ulong *)((long)&(local_130->m_backend).data + lVar16 + 0x30);
        if ((int)local_298._48_8_ == 2) {
LAB_002db830:
          _local_2b8 = SUB85(pDVar21[4],0);
          uStack_2b3 = SUB83(pDVar21[4],5);
          auVar13 = *(undefined1 (*) [16])pDVar21;
          local_2c8 = pDVar21[2];
          _uStack_2c0 = SUB85(pDVar21[3],0);
          uStack_2bb = SUB83(pDVar21[3],5);
          local_2b0 = (pSVar24->epsilon).m_backend.exp;
          local_2ac = (pSVar24->epsilon).m_backend.neg;
          local_2a8._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
          local_2a8._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
          local_2d8._0_4_ = (*pDVar21).info;
          if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
            local_2ac = (bool)(local_2ac ^ 1);
          }
          local_2d8 = auVar13;
          if ((((fpclass_type)local_2a8 != cpp_dec_float_NaN) &&
              (local_298.fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8),
             pSVar24 = local_2a0, -1 < iVar14)) {
            local_228 = pDVar21[4].info;
            uStack_224 = pDVar21[4].idx;
            local_248 = *pDVar21;
            DStack_240 = pDVar21[1];
            local_238 = pDVar21[2];
            _uStack_230 = SUB85(pDVar21[3],0);
            uStack_22b = SUB83(pDVar21[3],5);
            local_220 = (local_2a0->epsilon).m_backend.exp;
            local_21c = (local_2a0->epsilon).m_backend.neg;
            local_218._0_4_ = (local_2a0->epsilon).m_backend.fpclass;
            local_218._4_4_ = (local_2a0->epsilon).m_backend.prec_elem;
            if (((fpclass_type)local_218 != cpp_dec_float_NaN &&
                 local_298.fpclass != cpp_dec_float_NaN) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_298,(cpp_dec_float<50U,_int,_void> *)&local_248),
               pSVar24 = local_2a0, iVar14 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)
                         ((long)&(local_130->m_backend).data + lVar16),0.0);
              pSVar24 = local_2a0;
              goto LAB_002dbe08;
            }
          }
          piVar1 = piVar26 + 1;
          *piVar26 = (int)lVar25;
          if (local_124 == LEAVE) {
            if (pSVar24->iscoid == true) {
              pSVar6 = (pSVar24->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver;
              iVar14 = pSVar6->theRep *
                       ((pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.costat)->data[lVar25];
            }
            else {
              pSVar6 = (pSVar24->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver;
              iVar14 = pSVar6->theRep *
                       ((pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat)->data[lVar25];
            }
            piVar26 = piVar1;
            if (0 < iVar14) goto LAB_002dbe08;
          }
          local_250 = piVar1;
          if ((char)local_17c != '\0') {
            pSVar6 = (pSVar24->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar7 = (pSVar6->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar27)) {
              SPxColId::SPxColId((SPxColId *)local_2d8,
                                 (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar27));
              pDVar21 = local_188;
              iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar6->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)local_2d8);
              pSVar24 = local_2a0;
              piVar26 = local_250;
              if ((pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_002dbe08;
            }
          }
          _local_2b8 = SUB85(pDVar21[4],0);
          uStack_2b3 = SUB83(pDVar21[4],5);
          local_2d8 = *(undefined1 (*) [16])pDVar21;
          local_2c8 = pDVar21[2];
          _uStack_2c0 = SUB85(pDVar21[3],0);
          uStack_2bb = SUB83(pDVar21[3],5);
          local_2b0 = (pSVar24->epsilon).m_backend.exp;
          local_2ac = (pSVar24->epsilon).m_backend.neg;
          local_2a8._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
          local_2a8._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
          if (((fpclass_type)local_2a8 == cpp_dec_float_NaN ||
               local_298.fpclass == cpp_dec_float_NaN) ||
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8),
             pSVar24 = local_2a0, iVar14 < 1)) {
            _local_2b8 = SUB85(pDVar21[4],0);
            uStack_2b3 = SUB83(pDVar21[4],5);
            local_2c8 = pDVar21[2];
            _uStack_2c0 = SUB85(pDVar21[3],0);
            uStack_2bb = SUB83(pDVar21[3],5);
            local_2b0 = (pSVar24->epsilon).m_backend.exp;
            local_2ac = (pSVar24->epsilon).m_backend.neg;
            local_2a8._0_4_ = (pSVar24->epsilon).m_backend.fpclass;
            local_2a8._4_4_ = (pSVar24->epsilon).m_backend.prec_elem;
            local_2d8._0_4_ = (*pDVar21).info;
            if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
              local_2ac = (bool)(local_2ac ^ 1);
            }
            piVar26 = local_250;
            if ((((fpclass_type)local_2a8 != cpp_dec_float_NaN) &&
                (local_298.fpclass != cpp_dec_float_NaN)) &&
               (local_2d8 = *(undefined1 (*) [16])pDVar21,
               iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8),
               pSVar24 = local_2a0, piVar26 = local_250, iVar14 < 0)) {
              local_2d8._4_4_ = local_298.data._M_elems[1];
              local_2d8._0_4_ = local_298.data._M_elems[0];
              local_2d8._12_4_ = local_298.data._M_elems[3];
              local_2d8._8_4_ = local_298.data._M_elems[2];
              local_2c8.idx = local_298.data._M_elems[5];
              local_2c8.info = local_298.data._M_elems[4];
              _local_2b8 = (undefined5)
                           CONCAT44(local_298.data._M_elems[9],local_298.data._M_elems[8]);
              uStack_2b3 = (undefined3)(local_298.data._M_elems[9] >> 8);
              _uStack_2c0 = (undefined5)
                            CONCAT44(local_298.data._M_elems[7],local_298.data._M_elems[6]);
              uStack_2bb = (undefined3)(local_298.data._M_elems[7] >> 8);
              local_2b0 = local_298.exp;
              local_2ac = local_298.neg;
              local_2a8._0_4_ = local_298.fpclass;
              local_2a8._4_4_ = local_298.prec_elem;
              if (local_298.data._M_elems[0] != 0 || local_298.fpclass != 0) {
                local_2ac = (bool)(local_298.neg ^ 1);
              }
              if (((local_298.fpclass == 2) || (local_208.fpclass == cpp_dec_float_NaN)) ||
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_208),
                 iVar14 < 1)) {
                local_248.idx = local_208.data._M_elems[2];
                local_248.info = local_208.data._M_elems[1];
                DStack_240.idx = local_208.data._M_elems[4];
                DStack_240.info = local_208.data._M_elems[3];
                local_238.idx = local_208.data._M_elems[6];
                local_238.info = local_208.data._M_elems[5];
                _uStack_230 = (undefined5)
                              CONCAT44(local_208.data._M_elems[8],local_208.data._M_elems[7]);
                uStack_22b = (undefined3)(local_208.data._M_elems[8] >> 8);
                local_228 = local_208.data._M_elems[9];
              }
              else {
                local_248.idx = local_298.data._M_elems[2];
                local_248.info = local_298.data._M_elems[1];
                DStack_240.idx = local_298.data._M_elems[4];
                DStack_240.info = local_298.data._M_elems[3];
                local_238.idx = local_298.data._M_elems[6];
                local_238.info = local_298.data._M_elems[5];
                _uStack_230 = (undefined5)
                              CONCAT44(local_298.data._M_elems[8],local_298.data._M_elems[7]);
                uStack_22b = (undefined3)(local_298.data._M_elems[8] >> 8);
                local_228 = local_298.data._M_elems[9];
                local_208.neg =
                     (bool)((local_298.fpclass != 0 || local_298.data._M_elems[0] != 0) ^
                           local_298.neg);
                local_208.data._M_elems[0] = local_298.data._M_elems[0];
                local_208.exp = local_298.exp;
                local_208._48_8_ = local_298._48_8_;
              }
              local_208.data._M_elems[9] = local_228;
              local_208.data._M_elems[5] = local_238.info;
              local_208.data._M_elems[6] = local_238.idx;
              local_208.data._M_elems[7] = (uint)_uStack_230;
              local_208.data._M_elems[8] = (uint)(CONCAT35(uStack_22b,_uStack_230) >> 0x20);
              local_208.data._M_elems[1] = local_248.info;
              local_208.data._M_elems[2] = local_248.idx;
              local_208.data._M_elems[3] = DStack_240.info;
              local_208.data._M_elems[4] = DStack_240.idx;
              puVar3 = (uint *)((long)local_90 + lVar16 + -0x30);
              local_d8._0_8_ = *(undefined8 *)puVar3;
              local_d8._8_8_ = *(undefined8 *)(puVar3 + 2);
              pDVar4 = (DataKey *)((long)local_90 + lVar16 + -0x20);
              local_c8 = *pDVar4;
              DVar12 = pDVar4[1];
              _uStack_c0 = DVar12._0_5_;
              uStack_bb = DVar12.idx._1_3_;
              uVar5 = *(undefined8 *)((long)local_90 + lVar16 + -0x10);
              _local_b8 = (undefined5)uVar5;
              uStack_b3 = (undefined3)((ulong)uVar5 >> 0x28);
              local_b0 = *(int *)((long)local_90 + lVar16 + -8);
              local_ac = *(bool *)((long)local_90 + lVar16 + -4);
              local_a8 = *(undefined8 *)((long)local_90 + lVar16);
              ::soplex::infinity::__tls_init();
              local_2a8._0_4_ = cpp_dec_float_finite;
              local_2a8._4_4_ = 10;
              local_2d8 = ZEXT816(0);
              local_2c8.info = 0;
              local_2c8.idx = 0;
              _uStack_2c0 = 0;
              uStack_2bb = 0;
              _local_2b8 = 0;
              uStack_2b3 = 0;
              local_2b0 = 0;
              local_2ac = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_2d8,local_68);
              pSVar24 = local_2a0;
              piVar26 = local_250;
              if ((((fpclass_type)local_a8 != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_2a8 != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)local_d8,
                                      (cpp_dec_float<50U,_int,_void> *)local_2d8),
                 pSVar24 = local_2a0, piVar26 = local_250, iVar14 < 0)) {
                pcVar18 = (cpp_dec_float<50U,_int,_void> *)((long)&local_138->m_backend + lVar16);
                local_2a8._0_4_ = cpp_dec_float_finite;
                local_2a8._4_4_ = 10;
                local_2d8 = (undefined1  [16])0x0;
                local_2c8.info = 0;
                local_2c8.idx = 0;
                _uStack_2c0 = 0;
                uStack_2bb = 0;
                _local_2b8 = 0;
                uStack_2b3 = 0;
                local_2b0 = 0;
                local_2ac = false;
                if (pcVar18 == (cpp_dec_float<50U,_int,_void> *)local_2d8) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                             (cpp_dec_float<50U,_int,_void> *)local_d8);
                  if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
                    local_2ac = (bool)(local_2ac ^ 1);
                  }
                }
                else {
                  _local_2b8 = _local_b8;
                  uStack_2b3 = uStack_b3;
                  local_2c8 = local_c8;
                  _uStack_2c0 = _uStack_c0;
                  uStack_2bb = uStack_bb;
                  local_2d8._8_8_ = local_d8._8_8_;
                  local_2d8._0_8_ = local_d8._0_8_;
                  local_2b0 = local_b0;
                  local_2ac = local_ac;
                  local_2a8._0_4_ = (fpclass_type)local_a8;
                  local_2a8._4_4_ = local_a8._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar18);
                }
                pcVar18 = local_78;
                auVar13 = local_2d8;
                _local_1a8 = _local_2b8;
                uStack_1a3 = uStack_2b3;
                local_1b8 = local_2c8;
                _uStack_1b0 = _uStack_2c0;
                uStack_1ab = uStack_2bb;
                local_1c8.info = local_2d8._0_4_;
                local_1c8.idx = local_2d8._4_4_;
                DStack_1c0.info = local_2d8._8_4_;
                DStack_1c0.idx = local_2d8._12_4_;
                local_1a0 = local_2b0;
                local_19c = local_2ac;
                local_198._0_4_ = (fpclass_type)local_2a8;
                local_198._4_4_ = local_2a8._4_4_;
                local_2d8 = auVar13;
                if ((fpclass_type)local_2a8 != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0)
                  ;
                  pDVar21 = local_188;
                  iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                                      (cpp_dec_float<50U,_int,_void> *)local_2d8);
                  pcVar23 = pcVar18;
                  if (iVar14 < 1) goto LAB_002dc3aa;
                }
                local_218._0_4_ = cpp_dec_float_finite;
                local_218._4_4_ = 10;
                local_248.info = 0;
                local_248.idx = 0;
                DStack_240.info = 0;
                DStack_240.idx = 0;
                local_238.info = 0;
                local_238.idx = 0;
                _uStack_230 = 0;
                uStack_22b = 0;
                local_228 = 0;
                uStack_224 = 0;
                local_220 = 0;
                local_21c = false;
                pcVar23 = (cpp_dec_float<50U,_int,_void> *)&local_248;
                pcVar22 = (cpp_dec_float<50U,_int,_void> *)&local_1c8;
                if (pcVar23 != pcVar18) {
                  local_228 = (uint)_local_1a8;
                  uStack_224 = (uint)(CONCAT35(uStack_1a3,_local_1a8) >> 0x20);
                  local_238 = local_1b8;
                  _uStack_230 = _uStack_1b0;
                  uStack_22b = uStack_1ab;
                  local_248 = local_1c8;
                  DStack_240 = DStack_1c0;
                  local_220 = local_1a0;
                  local_21c = local_19c;
                  local_218._0_4_ = (fpclass_type)local_198;
                  local_218._4_4_ = local_198._4_4_;
                  pcVar22 = pcVar18;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (pcVar23,pcVar22);
                goto LAB_002dc3aa;
              }
            }
          }
          else {
            bVar8 = false;
            if ((local_298.fpclass != cpp_dec_float_NaN) && (local_208.fpclass != cpp_dec_float_NaN)
               ) {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_298,&local_208);
              bVar8 = 0 < iVar14;
            }
            pcVar18 = &local_208;
            if (bVar8) {
              pcVar18 = &local_298;
            }
            pcVar23 = &local_208;
            if (bVar8) {
              pcVar23 = &local_298;
            }
            pcVar22 = &local_208;
            if (bVar8) {
              pcVar22 = &local_298;
            }
            uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
            local_208.data._M_elems[8] = (uint)uVar5;
            local_208.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(pcVar18->data)._M_elems;
            uVar9 = *(undefined8 *)((pcVar18->data)._M_elems + 2);
            uVar10 = *(undefined8 *)((pcVar18->data)._M_elems + 4);
            uVar11 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
            local_208.data._M_elems[4] = (uint)uVar10;
            local_208.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
            local_208.data._M_elems[6] = (uint)uVar11;
            local_208.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
            local_208.data._M_elems[0] = (uint)uVar5;
            local_208.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_208.data._M_elems[2] = (uint)uVar9;
            local_208.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
            local_208.exp = pcVar23->exp;
            local_208.neg = pcVar22->neg;
            uVar28 = CONCAT44((int)((uint)bVar8 << 0x1f) >> 0x1f,(int)((uint)bVar8 << 0x1f) >> 0x1f)
            ;
            local_208._48_8_ = ~uVar28 & local_208._48_8_ | local_298._48_8_ & uVar28;
            puVar3 = (uint *)((long)local_88 + lVar16 + -0x30);
            local_118._0_8_ = *(undefined8 *)puVar3;
            local_118._8_8_ = *(undefined8 *)(puVar3 + 2);
            pDVar4 = (DataKey *)((long)local_88 + lVar16 + -0x20);
            local_108 = *pDVar4;
            DVar12 = pDVar4[1];
            _uStack_100 = DVar12._0_5_;
            uStack_fb = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)((long)local_88 + lVar16 + -0x10);
            _local_f8 = (undefined5)uVar5;
            uStack_f3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_f0 = *(int *)((long)local_88 + lVar16 + -8);
            local_ec = *(bool *)((long)local_88 + lVar16 + -4);
            local_e8 = *(undefined8 *)((long)local_88 + lVar16);
            ::soplex::infinity::__tls_init();
            local_2a8._0_4_ = cpp_dec_float_finite;
            local_2a8._4_4_ = 10;
            local_2d8 = ZEXT816(0);
            local_2c8.info = 0;
            local_2c8.idx = 0;
            _uStack_2c0 = 0;
            uStack_2bb = 0;
            _local_2b8 = 0;
            uStack_2b3 = 0;
            local_2b0 = 0;
            local_2ac = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2d8,(double)local_58);
            pSVar24 = local_2a0;
            piVar26 = local_250;
            if ((((fpclass_type)local_e8 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_2a8 != cpp_dec_float_NaN)) &&
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_118,
                                    (cpp_dec_float<50U,_int,_void> *)local_2d8), pSVar24 = local_2a0
               , piVar26 = local_250, 0 < iVar14)) {
              pcVar18 = (cpp_dec_float<50U,_int,_void> *)((long)&local_138->m_backend + lVar16);
              local_2a8._0_4_ = cpp_dec_float_finite;
              local_2a8._4_4_ = 10;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8.info = 0;
              local_2c8.idx = 0;
              _uStack_2c0 = 0;
              uStack_2bb = 0;
              _local_2b8 = 0;
              uStack_2b3 = 0;
              local_2b0 = 0;
              local_2ac = false;
              if (pcVar18 == (cpp_dec_float<50U,_int,_void> *)local_2d8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                           (cpp_dec_float<50U,_int,_void> *)local_118);
                if (local_2d8._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite) {
                  local_2ac = (bool)(local_2ac ^ 1);
                }
              }
              else {
                _local_2b8 = _local_f8;
                uStack_2b3 = uStack_f3;
                local_2c8 = local_108;
                _uStack_2c0 = _uStack_100;
                uStack_2bb = uStack_fb;
                local_2d8._8_8_ = local_118._8_8_;
                local_2d8._0_8_ = local_118._0_8_;
                local_2b0 = local_f0;
                local_2ac = local_ec;
                local_2a8._0_4_ = (fpclass_type)local_e8;
                local_2a8._4_4_ = local_e8._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar18);
              }
              pcVar18 = local_78;
              auVar13 = local_2d8;
              _local_1a8 = _local_2b8;
              uStack_1a3 = uStack_2b3;
              local_1b8 = local_2c8;
              _uStack_1b0 = _uStack_2c0;
              uStack_1ab = uStack_2bb;
              local_1c8.info = local_2d8._0_4_;
              local_1c8.idx = local_2d8._4_4_;
              DStack_1c0.info = local_2d8._8_4_;
              DStack_1c0.idx = local_2d8._12_4_;
              local_1a0 = local_2b0;
              local_19c = local_2ac;
              local_198._0_4_ = (fpclass_type)local_2a8;
              local_198._4_4_ = local_2a8._4_4_;
              local_2d8 = auVar13;
              if ((fpclass_type)local_2a8 != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0);
                pDVar21 = local_188;
                iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2d8);
                if (-1 < iVar14) {
                  uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_228 = (uint)uVar5;
                  uStack_224 = (uint)((ulong)uVar5 >> 0x20);
                  local_248.info = (pcVar18->data)._M_elems[0];
                  local_248.idx = (pcVar18->data)._M_elems[1];
                  DStack_240 = *(DataKey *)((pcVar18->data)._M_elems + 2);
                  local_238 = *(DataKey *)((pcVar18->data)._M_elems + 4);
                  uVar5 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  _uStack_230 = (undefined5)uVar5;
                  uStack_22b = (undefined3)((ulong)uVar5 >> 0x28);
                  local_220 = (local_2a0->fastDelta).m_backend.exp;
                  local_21c = (local_2a0->fastDelta).m_backend.neg;
                  local_218._0_4_ = (local_2a0->fastDelta).m_backend.fpclass;
                  local_218._4_4_ = (local_2a0->fastDelta).m_backend.prec_elem;
                  if ((fpclass_type)local_218 != cpp_dec_float_finite || local_248.info != 0) {
                    local_21c = (bool)(local_21c ^ 1);
                  }
                  pcVar23 = (cpp_dec_float<50U,_int,_void> *)&local_248;
                  goto LAB_002dc3aa;
                }
              }
              local_218._0_4_ = cpp_dec_float_finite;
              local_218._4_4_ = 10;
              local_248.info = 0;
              local_248.idx = 0;
              DStack_240.info = 0;
              DStack_240.idx = 0;
              local_238.info = 0;
              local_238.idx = 0;
              _uStack_230 = 0;
              uStack_22b = 0;
              local_228 = 0;
              uStack_224 = 0;
              local_220 = 0;
              local_21c = false;
              pcVar23 = (cpp_dec_float<50U,_int,_void> *)&local_248;
              if (pcVar23 == pcVar18) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (pcVar23,(cpp_dec_float<50U,_int,_void> *)&local_1c8);
                if (local_248.info != 0 || (fpclass_type)local_218 != cpp_dec_float_finite) {
                  local_21c = (bool)(local_21c ^ 1);
                }
              }
              else {
                local_228 = (uint)_local_1a8;
                uStack_224 = (uint)(CONCAT35(uStack_1a3,_local_1a8) >> 0x20);
                local_238 = local_1b8;
                _uStack_230 = _uStack_1b0;
                uStack_22b = uStack_1ab;
                local_248 = local_1c8;
                DStack_240 = DStack_1c0;
                local_220 = local_1a0;
                local_21c = local_19c;
                local_218._0_4_ = (fpclass_type)local_198;
                local_218._4_4_ = local_198._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (pcVar23,pcVar18);
              }
LAB_002dc3aa:
              local_2d8 = ZEXT816(0);
              local_2a8._0_4_ = cpp_dec_float_finite;
              local_2a8._4_4_ = 10;
              local_2ac = false;
              local_2b0 = 0;
              uStack_2b3 = 0;
              _local_2b8 = 0;
              uStack_2bb = 0;
              _uStack_2c0 = 0;
              local_2c8.info = 0;
              local_2c8.idx = 0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar23,&local_298);
              local_298.data._M_elems[8] = (uint)_local_2b8;
              local_298.data._M_elems[9] = (uint)(CONCAT35(uStack_2b3,_local_2b8) >> 0x20);
              local_298.data._M_elems[4] = local_2c8.info;
              local_298.data._M_elems[5] = local_2c8.idx;
              local_298.data._M_elems[6] = (uint)_uStack_2c0;
              local_298.data._M_elems[7] = (uint)(CONCAT35(uStack_2bb,_uStack_2c0) >> 0x20);
              local_298.data._M_elems[0] = local_2d8._0_4_;
              local_298.data._M_elems[1] = local_2d8._4_4_;
              local_298.data._M_elems[2] = local_2d8._8_4_;
              local_298.data._M_elems[3] = local_2d8._12_4_;
              local_298.exp = local_2b0;
              local_298.neg = local_2ac;
              local_298.fpclass = (fpclass_type)local_2a8;
              local_298.prec_elem = local_2a8._4_4_;
              uVar5 = local_298._48_8_;
              local_298.fpclass = (fpclass_type)local_2a8;
              pSVar24 = local_2a0;
              piVar26 = local_250;
              if (((local_298.fpclass != cpp_dec_float_NaN) &&
                  (local_178.fpclass != cpp_dec_float_NaN)) &&
                 (local_298._48_8_ = uVar5,
                 iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_298,&local_178), pSVar24 = local_2a0,
                 piVar26 = local_250, 0 < iVar14)) {
                local_178.data._M_elems._32_5_ =
                     SUB85(CONCAT44(local_298.data._M_elems[9],local_298.data._M_elems[8]),0);
                local_178.data._M_elems[9]._1_3_ = (undefined3)(local_298.data._M_elems[9] >> 8);
                local_178.data._M_elems[1] = local_298.data._M_elems[1];
                local_178.data._M_elems[0] = local_298.data._M_elems[0];
                local_178.data._M_elems[3] = local_298.data._M_elems[3];
                local_178.data._M_elems[2] = local_298.data._M_elems[2];
                local_178.data._M_elems[5] = local_298.data._M_elems[5];
                local_178.data._M_elems[4] = local_298.data._M_elems[4];
                local_178.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_298.data._M_elems[7],local_298.data._M_elems[6]),0);
                local_178.data._M_elems[7]._1_3_ = (undefined3)(local_298.data._M_elems[7] >> 8);
                local_178.exp = local_298.exp;
                local_178.neg = local_298.neg;
                local_178.fpclass = local_298.fpclass;
                local_178.prec_elem = local_298.prec_elem;
                local_254 = (int)lVar25;
              }
            }
          }
        }
        else {
          local_2a8._0_4_ = cpp_dec_float_finite;
          local_2a8._4_4_ = 10;
          local_2d8 = (undefined1  [16])0x0;
          local_2c8.info = 0;
          local_2c8.idx = 0;
          _uStack_2c0 = 0;
          uStack_2bb = 0;
          _local_2b8 = 0;
          uStack_2b3 = 0;
          local_2b0 = 0;
          local_2ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
          pDVar21 = local_188;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_298,(cpp_dec_float<50U,_int,_void> *)local_2d8);
          pSVar24 = local_2a0;
          if (iVar14 != 0) goto LAB_002db830;
        }
LAB_002dbe08:
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 8;
        pnVar17 = (pointer)((long)&local_130[1].m_backend.data + lVar16);
        lVar16 = lVar16 + 0x38;
      } while (pnVar17 < local_80);
    }
    (local_98->thedelta).super_IdxSet.num =
         (int)((ulong)((long)piVar26 - (long)(local_98->thedelta).super_IdxSet.idx) >> 2);
    (local_98->thedelta).setupStatus = true;
  }
  *(ulong *)((local_40->m_backend).data._M_elems + 8) =
       CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
  *(undefined8 *)((local_40->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
  *(ulong *)((local_40->m_backend).data._M_elems + 6) =
       CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
  *(undefined8 *)(local_40->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
  (local_40->m_backend).exp = local_178.exp;
  (local_40->m_backend).neg = local_178.neg;
  (local_40->m_backend).fpclass = local_178.fpclass;
  (local_40->m_backend).prec_elem = local_178.prec_elem;
  *(ulong *)((local_38->m_backend).data._M_elems + 8) =
       CONCAT44(local_208.data._M_elems[9],local_208.data._M_elems[8]);
  *(ulong *)((local_38->m_backend).data._M_elems + 4) =
       CONCAT44(local_208.data._M_elems[5],local_208.data._M_elems[4]);
  *(ulong *)((local_38->m_backend).data._M_elems + 6) =
       CONCAT44(local_208.data._M_elems[7],local_208.data._M_elems[6]);
  *(ulong *)(local_38->m_backend).data._M_elems =
       CONCAT44(local_208.data._M_elems[1],local_208.data._M_elems[0]);
  *(ulong *)((local_38->m_backend).data._M_elems + 2) =
       CONCAT44(local_208.data._M_elems[3],local_208.data._M_elems[2]);
  (local_38->m_backend).exp = local_208.exp;
  (local_38->m_backend).neg = local_208.neg;
  (local_38->m_backend).fpclass = local_208.fpclass;
  (local_38->m_backend).prec_elem = local_208.prec_elem;
  return local_254;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}